

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

bool axl::io::matchWildcard(StringRef *string0,StringRef *wildcard0)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  char c;
  char *wildcardBookmark;
  char *stringBookmark;
  char *string;
  char *wildcard;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  bool local_1;
  
  local_20 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                       ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                        CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  bVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(in_RDI);
  if (bVar3) {
    for (; *local_20 == '*'; local_20 = local_20 + 1) {
    }
    cVar2 = *local_20;
  }
  else {
    local_28 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                         ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    local_30 = (char *)0x0;
    local_38 = (char *)0x0;
LAB_0016e366:
    do {
      if (*local_20 == '*') {
        do {
          local_38 = local_20 + 1;
          pcVar1 = local_20 + 1;
          local_20 = local_38;
        } while (*pcVar1 == '*');
        if (*local_38 == '\0') {
          return true;
        }
        if (*local_38 != '?') {
          while (*local_28 != *local_38) {
            pcVar1 = local_28 + 1;
            local_28 = local_28 + 1;
            if (*pcVar1 == '\0') {
              return false;
            }
          }
        }
        local_30 = local_28;
      }
      else if ((*local_28 != *local_20) && (*local_20 != '?')) {
        if (local_38 != (char *)0x0) {
          if (local_20 != local_38) {
            local_20 = local_38;
            if (*local_28 != *local_38) {
              local_30 = local_30 + 1;
              local_28 = local_30;
              goto LAB_0016e366;
            }
            local_20 = local_38 + 1;
          }
          if (*local_28 != '\0') {
            local_28 = local_28 + 1;
            goto LAB_0016e366;
          }
        }
        return false;
      }
      local_28 = local_28 + 1;
      local_20 = local_20 + 1;
    } while (*local_28 != '\0');
    for (; *local_20 == '*'; local_20 = local_20 + 1) {
    }
    cVar2 = *local_20;
  }
  local_1 = cVar2 == '\0';
  return local_1;
}

Assistant:

bool
matchWildcard(
	const sl::StringRef& string0,
	const sl::StringRef& wildcard0
) {
	const char* wildcard = wildcard0.sz();

	if (string0.isEmpty()) { // empty input shortcut
		while (*wildcard == '*')
			wildcard++;

		return *wildcard == '\0';
	}

	const char* string = string0.sz();
	const char* stringBookmark = NULL;
	const char* wildcardBookmark = NULL;
	char c;

	for (;;) {
		if (*wildcard == '*') {
			while (*++wildcard == '*')
				;

			if (!*wildcard)
				return true;

			if (*wildcard != '?') {
				while (*string != *wildcard) {
					if (!(*(++string)))
						return false;
				}
			}

			wildcardBookmark = wildcard;
			stringBookmark = string;
		} else {
			c = *string;
			if (c != *wildcard && *wildcard != '?') {
				if (wildcardBookmark) {
					if (wildcard != wildcardBookmark) {
						wildcard = wildcardBookmark;

						if (c != *wildcard) {
							string = ++stringBookmark;
							continue;
						} else {
							wildcard++;
						}
					}

					if (*string) {
						string++;
						continue;
					}
				}

				return false;
			}
		}

		string++;
		wildcard++;

		if (!*string) {
			while (*wildcard == '*')
				wildcard++;

			return !*wildcard;
		}
	}
}